

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void vinsertf32x8(PDISASM pMyDisasm)

{
  char *pcVar1;
  UInt8 UVar2;
  Int32 IVar3;
  UInt8 UVar4;
  
  if (((pMyDisasm->Reserved_).EVEX.state != '\x01') || ((pMyDisasm->Reserved_).VEX.pp != '\x01')) {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
    return;
  }
  UVar2 = (pMyDisasm->Reserved_).VEX.L;
  if (UVar2 == '\0') {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  pcVar1 = (pMyDisasm->Instruction).Mnemonic;
  if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
    builtin_strncpy(pcVar1,"vinsertf32x8",0xd);
    UVar4 = '\v';
  }
  else {
    builtin_strncpy(pcVar1,"vinsertf64x4",0xd);
    UVar4 = '\n';
  }
  (pMyDisasm->Reserved_).EVEX.tupletype = UVar4;
  (pMyDisasm->Instruction).Category = 0x140000;
  (pMyDisasm->Reserved_).MemDecoration = 0xd2;
  if (UVar2 == '\0') {
    IVar3 = 4;
  }
  else if (UVar2 == '\x01') {
    IVar3 = 8;
  }
  else {
    IVar3 = 0x10;
    if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') goto LAB_00139b06;
  }
  (pMyDisasm->Reserved_).Register_ = IVar3;
LAB_00139b06:
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  fillRegister((uint)(pMyDisasm->Reserved_).EVEX.V << 4 |
               ~(uint)(pMyDisasm->Reserved_).VEX.vvvv & 0xf,&pMyDisasm->Operand2,pMyDisasm);
  (pMyDisasm->Reserved_).Register_ = 8;
  decodeModrm(&pMyDisasm->Operand3,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  getImmediat8(&pMyDisasm->Operand4,pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ vinsertf32x8(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.VEX.L == 0) GV.ERROR_OPCODE = UD_;
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vinsertf32x8");
        #endif
        GV.EVEX.tupletype = TUPLE8;
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vinsertf64x4");
        #endif
        GV.EVEX.tupletype = TUPLE4;
      }
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      GV.MemDecoration = Arg3_m256_ymm;
      if (GV.VEX.L == 0) {
        GV.Register_ = SSE_REG;
      }
      else if (GV.VEX.L == 0x1) {
        GV.Register_ = AVX_REG;
      }
      else if (GV.EVEX.LL == 0x2) {
        GV.Register_ = AVX512_REG;
      }
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand2, pMyDisasm);
      GV.Register_ = AVX_REG;
      decodeModrm(&pMyDisasm->Operand3, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
      getImmediat8(&pMyDisasm->Operand4, pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
  }
  else {
    failDecode(pMyDisasm);
  }

}